

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_boolean<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  pointer puVar2;
  undefined8 uVar3;
  int iVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  basic_value<toml::type_config> *pbVar5;
  scanner_storage *other;
  pointer psVar6;
  _Alloc_hider _Var7;
  string str;
  region reg;
  undefined1 local_3d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  string local_3a0;
  string local_380;
  undefined1 local_360 [48];
  size_t local_330;
  size_t sStack_328;
  size_t local_320;
  pointer pcStack_318;
  size_t local_310;
  size_t sStack_308;
  size_t local_300;
  undefined1 local_2f8 [48];
  size_t local_2c8;
  size_t sStack_2c0;
  size_t local_2b8;
  _Alloc_hider _Stack_2b0;
  size_t local_2a8;
  size_t sStack_2a0;
  size_t local_298;
  undefined1 local_290 [8];
  undefined1 local_288 [24];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  undefined8 local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  size_type local_230;
  undefined1 local_228 [80];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d8;
  _Alloc_hider local_1d0;
  literal local_1c8;
  location local_1b0;
  literal local_168;
  basic_value<toml::type_config> local_150;
  failure<toml::error_info> local_88;
  
  local_3d8._0_8_ = &PTR__scanner_base_0055f978;
  local_3d8._8_8_ = "true";
  local_3c8._M_allocated_capacity = 4;
  local_1c8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0055f978;
  local_1c8.value_ = "false";
  local_1c8.size_ = 5;
  either::either<toml::detail::literal,toml::detail::literal>
            ((either *)local_290,(literal *)local_3d8,&local_1c8);
  uVar3 = local_288._8_8_;
  psVar6 = (pointer)CONCAT71(local_288._1_7_,local_288[0]);
  if (psVar6 != (pointer)local_288._8_8_) {
    do {
      _Var1._M_head_impl =
           (psVar6->scanner_)._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var1._M_head_impl)->_vptr_scanner_base[2])((region *)local_2f8,_Var1._M_head_impl,loc);
      if ((element_type *)local_2f8._0_8_ != (element_type *)0x0) goto LAB_003bf5d1;
      region::~region((region *)local_2f8);
      psVar6 = psVar6 + 1;
    } while (psVar6 != (pointer)uVar3);
  }
  region::region((region *)local_2f8);
LAB_003bf5d1:
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          local_288);
  if ((element_type *)local_2f8._0_8_ == (element_type *)0x0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_380,
               "toml::parse_boolean: invalid boolean: boolean must be `true` or `false`, in lowercase. string must be surrounded by `\"`"
               ,"");
    local_1c8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0055f978;
    local_1c8.value_ = "true";
    local_1c8.size_ = 4;
    local_168.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0055f978;
    local_168.value_ = "false";
    local_168.size_ = 5;
    either::either<toml::detail::literal,toml::detail::literal>
              ((either *)local_3d8,&local_1c8,&local_168);
    location::location(&local_1b0,loc);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"");
    make_syntax_error<toml::detail::either>
              ((error_info *)local_290,&local_380,(either *)local_3d8,&local_1b0,&local_3a0);
    err<toml::error_info>(&local_88,(error_info *)local_290);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258 != &local_248) {
      operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_270);
    if ((undefined1 *)CONCAT71(local_290._1_7_,local_290[0]) != local_288 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_290._1_7_,local_290[0]),
                      (ulong)(local_288._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_1b0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_3d8 + 8));
    _Var7._M_p = local_380._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p == &local_380.field_2) goto LAB_003bf9a9;
  }
  else {
    puVar2 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f8._0_8_)->
             _M_impl).super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_3d8,(detail *)(puVar2 + sStack_2c0),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar2 + local_2a8),in_RCX);
    iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                    "true");
    local_230 = local_2f8._24_8_;
    local_248._8_8_ = local_2f8._8_8_;
    local_248._M_allocated_capacity = local_2f8._0_8_;
    local_2f8._0_8_ = (element_type *)0x0;
    local_2f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_360._16_8_ = local_360 + 0x20;
    if ((basic_value<toml::type_config> *)local_2f8._16_8_ ==
        (basic_value<toml::type_config> *)(local_2f8 + 0x20)) {
      local_360._40_8_ = local_2f8._40_8_;
      local_2f8._16_8_ = local_360._16_8_;
    }
    local_360._33_7_ = local_2f8._33_7_;
    local_360[0x20] = local_2f8[0x20];
    local_288[0] = iVar4 == 0;
    local_2f8._24_8_ = 0;
    local_2f8[0x20] = '\0';
    local_330 = local_2c8;
    sStack_328 = sStack_2c0;
    local_320 = local_2b8;
    pcStack_318 = _Stack_2b0._M_p;
    local_310 = local_2a8;
    sStack_308 = sStack_2a0;
    local_300 = local_298;
    local_290[0] = (toml)0x1;
    local_360._0_8_ = (element_type *)0x0;
    local_360._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pbVar5 = (basic_value<toml::type_config> *)local_360._32_8_;
    local_238._M_p = (pointer)local_2f8._16_8_;
    if (local_2f8._16_8_ == local_360._16_8_) {
      local_228._8_8_ = local_360._40_8_;
      pbVar5 = (basic_value<toml::type_config> *)local_2f8._16_8_;
      local_238._M_p = (pointer)local_228;
    }
    local_360._24_8_ = 0;
    local_360._32_8_ = (ulong)(uint7)local_2f8._33_7_ << 8;
    local_228._16_8_ = local_2c8;
    local_228._24_8_ = sStack_2c0;
    local_228._32_8_ = local_2b8;
    local_228._40_8_ = _Stack_2b0._M_p;
    local_228._48_8_ = local_2a8;
    local_228._56_8_ = sStack_2a0;
    local_228._64_8_ = local_298;
    local_228._72_8_ = (pointer)0x0;
    _Stack_1d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d0._M_p = (pointer)0x0;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8._16_8_ = (basic_value<toml::type_config> *)(local_2f8 + 0x20);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_150,(toml *)local_290,pbVar5
              );
    __return_storage_ptr__->is_ok_ = true;
    pbVar5 = &local_150;
    basic_value<toml::type_config>::basic_value
              (&(__return_storage_ptr__->field_1).succ_.value,pbVar5);
    basic_value<toml::type_config>::cleanup(&local_150,(EVP_PKEY_CTX *)pbVar5);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_150.comments_);
    region::~region(&local_150.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_290,(EVP_PKEY_CTX *)pbVar5);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_228 + 0x48));
    region::~region((region *)&local_248);
    region::~region((region *)local_360);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3b8);
    local_380.field_2._M_allocated_capacity = local_3c8._M_allocated_capacity;
    _Var7._M_p = (pointer)local_3d8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._0_8_ == &local_3c8) goto LAB_003bf9a9;
  }
  operator_delete(_Var7._M_p,local_380.field_2._M_allocated_capacity + 1);
LAB_003bf9a9:
  region::~region((region *)local_2f8);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_boolean(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::boolean(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_boolean: "
            "invalid boolean: boolean must be `true` or `false`, in lowercase. "
            "string must be surrounded by `\"`", syntax::boolean(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    const auto str = reg.as_string();
    const auto val = [&str]() {
        if(str == "true")
        {
            return true;
        }
        else
        {
            assert(str == "false");
            return false;
        }
    }();

    // ----------------------------------------------------------------------
    // no format info for boolean
    boolean_format_info fmt;

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}